

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QTimeZonePrivate::Data>::reallocateAndGrow
          (QArrayDataPointer<QTimeZonePrivate::Data> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTimeZonePrivate::Data> *old)

{
  Data *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  Data *data;
  Data *pDVar9;
  long lVar10;
  Data *pDVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<QTimeZonePrivate::Data> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QTimeZonePrivate::Data> *)0x0 && where == GrowsAtEnd) &&
       (pDVar1 = this->d, pDVar1 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::reallocate
                ((QMovableArrayOps<QTimeZonePrivate::Data> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 4) * -0x5555555555555555,Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if (local_48.ptr == (Data *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar10 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QTimeZonePrivate::Data> *)0x0))
           || (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar10) {
            pDVar9 = this->ptr;
            pDVar11 = pDVar9 + lVar10;
            do {
              pDVar2 = (pDVar9->abbreviation).d.d;
              local_48.ptr[local_48.size].abbreviation.d.d = pDVar2;
              local_48.ptr[local_48.size].abbreviation.d.ptr = (pDVar9->abbreviation).d.ptr;
              local_48.ptr[local_48.size].abbreviation.d.size = (pDVar9->abbreviation).d.size;
              if (pDVar2 != (Data *)0x0) {
                LOCK();
                (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                     (__atomic_base<int>)
                     ((__int_type_conflict)
                      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
                UNLOCK();
              }
              local_48.ptr[local_48.size].daylightTimeOffset = pDVar9->daylightTimeOffset;
              iVar7 = pDVar9->offsetFromUtc;
              iVar8 = pDVar9->standardTimeOffset;
              local_48.ptr[local_48.size].atMSecsSinceEpoch = pDVar9->atMSecsSinceEpoch;
              local_48.ptr[local_48.size].offsetFromUtc = iVar7;
              local_48.ptr[local_48.size].standardTimeOffset = iVar8;
              pDVar9 = pDVar9 + 1;
              local_48.size = local_48.size + 1;
            } while (pDVar9 < pDVar11);
          }
        }
        else if (0 < lVar10) {
          pDVar9 = this->ptr;
          pDVar11 = pDVar9 + lVar10;
          do {
            pDVar2 = (pDVar9->abbreviation).d.d;
            (pDVar9->abbreviation).d.d = (Data *)0x0;
            local_48.ptr[local_48.size].abbreviation.d.d = pDVar2;
            pcVar3 = (pDVar9->abbreviation).d.ptr;
            (pDVar9->abbreviation).d.ptr = (char16_t *)0x0;
            local_48.ptr[local_48.size].abbreviation.d.ptr = pcVar3;
            qVar4 = (pDVar9->abbreviation).d.size;
            (pDVar9->abbreviation).d.size = 0;
            local_48.ptr[local_48.size].abbreviation.d.size = qVar4;
            uVar6 = *(undefined8 *)&pDVar9->offsetFromUtc;
            local_48.ptr[local_48.size].atMSecsSinceEpoch = pDVar9->atMSecsSinceEpoch;
            (&local_48.ptr[local_48.size].atMSecsSinceEpoch)[1] = uVar6;
            local_48.ptr[local_48.size].daylightTimeOffset = pDVar9->daylightTimeOffset;
            pDVar9 = pDVar9 + 1;
            local_48.size = local_48.size + 1;
          } while (pDVar9 < pDVar11);
        }
      }
      pDVar1 = this->d;
      pDVar9 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar5 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = pDVar1;
      local_48.ptr = pDVar9;
      local_48.size = (qsizetype)puVar5;
      if (old != (QArrayDataPointer<QTimeZonePrivate::Data> *)0x0) {
        local_48.d = old->d;
        local_48.ptr = old->ptr;
        old->d = pDVar1;
        old->ptr = pDVar9;
        local_48.size = old->size;
        old->size = (qsizetype)puVar5;
      }
      ~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }